

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O3

void FAudioVoice_GetVoiceDetails(FAudioVoice *voice,FAudioVoiceDetails *pVoiceDetails)

{
  uint32_t uVar1;
  FAudioVoiceType FVar2;
  uint32_t *puVar3;
  
  uVar1 = voice->flags;
  pVoiceDetails->CreationFlags = uVar1;
  pVoiceDetails->ActiveFlags = uVar1;
  FVar2 = voice->type;
  if (FVar2 == FAUDIO_VOICE_MASTER) {
    pVoiceDetails->InputChannels = (voice->field_19).master.inputChannels;
    puVar3 = &(voice->field_19).master.inputSampleRate;
  }
  else if (FVar2 == FAUDIO_VOICE_SUBMIX) {
    pVoiceDetails->InputChannels = (voice->field_19).mix.inputChannels;
    puVar3 = &(voice->field_19).mix.inputSampleRate;
  }
  else {
    if (FVar2 != FAUDIO_VOICE_SOURCE) {
      return;
    }
    pVoiceDetails->InputChannels = (uint)((voice->field_19).src.format)->nChannels;
    puVar3 = &((voice->field_19).src.format)->nSamplesPerSec;
  }
  pVoiceDetails->InputSampleRate = *puVar3;
  return;
}

Assistant:

void FAudioVoice_GetVoiceDetails(
	FAudioVoice *voice,
	FAudioVoiceDetails *pVoiceDetails
) {
	LOG_API_ENTER(voice->audio)

	pVoiceDetails->CreationFlags = voice->flags;
	pVoiceDetails->ActiveFlags = voice->flags;
	if (voice->type == FAUDIO_VOICE_SOURCE)
	{
		pVoiceDetails->InputChannels = voice->src.format->nChannels;
		pVoiceDetails->InputSampleRate = voice->src.format->nSamplesPerSec;
	}
	else if (voice->type == FAUDIO_VOICE_SUBMIX)
	{
		pVoiceDetails->InputChannels = voice->mix.inputChannels;
		pVoiceDetails->InputSampleRate = voice->mix.inputSampleRate;
	}
	else if (voice->type == FAUDIO_VOICE_MASTER)
	{
		pVoiceDetails->InputChannels = voice->master.inputChannels;
		pVoiceDetails->InputSampleRate = voice->master.inputSampleRate;
	}
	else
	{
		FAudio_assert(0 && "Unknown voice type!");
	}

	LOG_API_EXIT(voice->audio)
}